

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pass.cpp
# Opt level: O0

bool __thiscall spvtools::opt::MemPass::IsLiveVar(MemPass *this,uint32_t varId)

{
  Op OVar1;
  uint32_t uVar2;
  DefUseManager *pDVar3;
  Instruction *pIVar4;
  Instruction *varTypeInst;
  uint32_t varTypeId;
  Instruction *varInst;
  uint32_t varId_local;
  MemPass *this_local;
  
  pDVar3 = Pass::get_def_use_mgr(&this->super_Pass);
  pIVar4 = analysis::DefUseManager::GetDef(pDVar3,varId);
  OVar1 = Instruction::opcode(pIVar4);
  if (OVar1 == OpVariable) {
    uVar2 = Instruction::type_id(pIVar4);
    pDVar3 = Pass::get_def_use_mgr(&this->super_Pass);
    pIVar4 = analysis::DefUseManager::GetDef(pDVar3,uVar2);
    uVar2 = Instruction::GetSingleWordInOperand(pIVar4,0);
    if (uVar2 == 7) {
      this_local._7_1_ = HasLoads(this,varId);
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool MemPass::IsLiveVar(uint32_t varId) const {
  const Instruction* varInst = get_def_use_mgr()->GetDef(varId);
  // assume live if not a variable eg. function parameter
  if (varInst->opcode() != spv::Op::OpVariable) return true;
  // non-function scope vars are live
  const uint32_t varTypeId = varInst->type_id();
  const Instruction* varTypeInst = get_def_use_mgr()->GetDef(varTypeId);
  if (spv::StorageClass(varTypeInst->GetSingleWordInOperand(
          kTypePointerStorageClassInIdx)) != spv::StorageClass::Function)
    return true;
  // test if variable is loaded from
  return HasLoads(varId);
}